

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

void rw::wdgl::unpackattrib(float *dst,uint8 *src,AttribDesc *a,float32 scale)

{
  ulong uVar1;
  ulong uVar2;
  float32 fVar3;
  
  switch(a->type) {
  case 0:
    memcpy(dst,src,(long)a->size << 2);
    return;
  case 1:
    uVar2 = 0;
    uVar1 = (ulong)(uint)a->size;
    if (a->size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      fVar3 = scale;
      if (a->normalized != 0) {
        fVar3 = 127.0;
      }
      dst[uVar2] = (float)(int)(char)src[uVar2] / (float)fVar3;
    }
    break;
  case 2:
    uVar2 = 0;
    uVar1 = (ulong)(uint)a->size;
    if (a->size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      fVar3 = scale;
      if (a->normalized != 0) {
        fVar3 = 255.0;
      }
      dst[uVar2] = (float)src[uVar2] / (float)fVar3;
    }
    break;
  case 3:
    uVar2 = 0;
    uVar1 = (ulong)(uint)a->size;
    if (a->size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      fVar3 = scale;
      if (a->normalized != 0) {
        fVar3 = 32767.0;
      }
      dst[uVar2] = (float)(int)*(short *)(src + uVar2 * 2) / (float)fVar3;
    }
    break;
  case 4:
    uVar2 = 0;
    uVar1 = (ulong)(uint)a->size;
    if (a->size < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      fVar3 = scale;
      if (a->normalized != 0) {
        fVar3 = 65435.0;
      }
      dst[uVar2] = (float)*(ushort *)(src + uVar2 * 2) / (float)fVar3;
    }
  }
  return;
}

Assistant:

void
unpackattrib(float *dst, uint8 *src, AttribDesc *a, float32 scale=1.0f)
{
	int8 *i8src;
	uint16 *u16src;
	int16 *i16src;

	switch(a->type){
	case 0:	// float
		memcpy(dst, src, a->size*4);
		break;

	// TODO: maybe have loop inside if?
	case 1: // byte
		i8src = (int8*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = i8src[i]/scale;
			else
				dst[i] = i8src[i]/127.0f;
		}
		break;

	case 2: // ubyte
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = src[i]/scale;
			else
				dst[i] = src[i]/255.0f;
		}
		break;

	case 3: // short
		i16src = (int16*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = i16src[i]/scale;
			else
				dst[i] = i16src[i]/32767.0f;
		}
		break;

	case 4: // ushort
		u16src = (uint16*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = u16src[i]/scale;
			else
				dst[i] = u16src[i]/65435.0f;
		}
		break;
	}
}